

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_effects.c
# Opt level: O0

void freetypeinfo(MOJOSHADER_symbolTypeInfo *typeinfo,MOJOSHADER_free f,void *d)

{
  uint local_24;
  int i;
  void *d_local;
  MOJOSHADER_free f_local;
  MOJOSHADER_symbolTypeInfo *typeinfo_local;
  
  for (local_24 = 0; local_24 < typeinfo->member_count; local_24 = local_24 + 1) {
    (*f)(typeinfo->members[(int)local_24].name,d);
    freetypeinfo(&typeinfo->members[(int)local_24].info,f,d);
  }
  (*f)(typeinfo->members,d);
  return;
}

Assistant:

void freetypeinfo(MOJOSHADER_symbolTypeInfo *typeinfo,
                  MOJOSHADER_free f, void *d)
{
    int i;
    for (i = 0; i < typeinfo->member_count; i++)
    {
        f((void *) typeinfo->members[i].name, d);
        freetypeinfo(&typeinfo->members[i].info, f, d);
    } // for
    f((void *) typeinfo->members, d);
}